

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmedian.hpp
# Opt level: O0

vector<Param,_std::allocator<Param>_> * __thiscall
TMedian::Params(vector<Param,_std::allocator<Param>_> *__return_storage_ptr__,TMedian *this)

{
  initializer_list<Param> __l;
  allocator<Param> local_89;
  Param local_88;
  char *local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined8 uStack_60;
  char *local_58;
  undefined8 uStack_50;
  char *local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined8 uStack_30;
  iterator local_28;
  size_type local_20;
  TMedian *local_18;
  TMedian *this_local;
  
  local_38 = "v";
  uStack_30 = 0x100010000000001;
  local_48 = "u";
  uStack_40 = 0x100010000000001;
  local_58 = "y";
  uStack_50 = 0x100010000000001;
  local_68 = "planes";
  uStack_60 = 0x101010100000001;
  local_78 = "radius";
  uStack_70 = 0x101010000000001;
  local_88.Name = "clip";
  local_88.Type = Clip;
  local_88.IsArray = false;
  local_88.AVSEnabled = true;
  local_88.VSEnabled = true;
  local_88.IsOptional = false;
  local_28 = &local_88;
  local_20 = 6;
  local_18 = this;
  this_local = (TMedian *)__return_storage_ptr__;
  std::allocator<Param>::allocator(&local_89);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<Param,_std::allocator<Param>_>::vector(__return_storage_ptr__,__l,&local_89);
  std::allocator<Param>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<Param> Params() const override {
    return std::vector<Param> {
      Param {"clip", Clip, false, true, true, false},
      Param {"radius", Integer},
      Param {"planes", Integer, true},
      Param {"y", Integer, false, true, false},
      Param {"u", Integer, false, true, false},
      Param {"v", Integer, false, true, false}
    };
  }